

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall
cs::method_involve::preprocess
          (method_involve *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  iterator *piVar1;
  char cVar2;
  value_type ptVar3;
  char *pcVar4;
  proxy *ppVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Elt_pointer pdVar8;
  _Elt_pointer ppsVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  int iVar17;
  undefined1 auVar18 [11];
  undefined1 auVar19 [11];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [13];
  undefined1 auVar23 [13];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *pdVar26;
  method_involve *pmVar27;
  int iVar28;
  const_reference pptVar29;
  token_base **pptVar30;
  token_base *ptVar31;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined *puVar32;
  shared_ptr<cs::name_space> *psVar33;
  tree_node *ptVar34;
  undefined4 extraout_var_01;
  compile_error *this_00;
  uint uVar35;
  size_t sVar36;
  domain_type *domain;
  _Elt_pointer pptVar37;
  domain_type *__range3;
  value_type *it;
  slot_type *name;
  char *pcVar38;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  var ns;
  any local_68;
  undefined1 local_60 [32];
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *local_40;
  method_involve *local_38;
  
  sVar36 = 1;
  pptVar29 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                       ((raw->
                        super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                        )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar3 = *pptVar29;
  local_60._0_8_ = ptVar3[1]._vptr_token_base;
  pptVar30 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_60);
  ptVar31 = *pptVar30;
  if ((ptVar31 == (token_base *)0x0) ||
     (ptVar31->_vptr_token_base != (_func_int **)&PTR__token_value_0032c608)) {
    ptVar31 = (token_base *)0x0;
  }
  if (ptVar31 == (token_base *)0x0) {
    ptVar34 = (tree_node *)statement_base::operator_new((statement_base *)0x30,sVar36);
    iVar28 = tree_type<cs::token_base_*>::copy
                       ((EVP_PKEY_CTX *)ptVar3[1]._vptr_token_base,(EVP_PKEY_CTX *)0x0);
    peVar6 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var7 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    pdVar8 = (raw->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar37 = (pdVar8->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar37 ==
        (pdVar8->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar37 = (pdVar8->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ptVar31 = pptVar37[-1];
    ptVar34->root = (tree_node *)&PTR__statement_base_0032c410;
    (((context_t *)&ptVar34->left)->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = peVar6;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptVar34->right)->_M_pi = p_Var7;
    ptVar34->data = (token_base *)ptVar31->line_num;
    ptVar34->root = (tree_node *)&PTR__statement_involve_0032cf90;
    *(undefined1 *)&ptVar34[1].root = 0;
    (((context_t *)&ptVar34[1].left)->
    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)CONCAT44(extraout_var_00,iVar28);
    ppsVar9 = (this->mResult).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    local_60._0_8_ = ptVar34;
    if (ppsVar9 ==
        (this->mResult).
        super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
      _M_push_back_aux<cs::statement_involve*>
                ((deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)&this->mResult,
                 (statement_involve **)local_60);
    }
    else {
      *ppsVar9 = (statement_base *)ptVar34;
      piVar1 = &(this->mResult).
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  }
  else {
    local_68.mDat = (proxy *)ptVar31[1]._vptr_token_base;
    if (local_68.mDat == (proxy *)0x0) {
      puVar32 = &void::typeinfo;
    }
    else {
      (local_68.mDat)->refcount = (local_68.mDat)->refcount + 1;
      iVar28 = (*(local_68.mDat)->data->_vptr_baseHolder[2])();
      puVar32 = (undefined *)CONCAT44(extraout_var,iVar28);
    }
    pcVar4 = *(char **)(puVar32 + 8);
    if ((pcVar4 != "St10shared_ptrIN2cs10name_spaceEE") &&
       ((*pcVar4 == '*' ||
        (iVar28 = strcmp(pcVar4,"St10shared_ptrIN2cs10name_spaceEE"), iVar28 != 0)))) {
      this_00 = (compile_error *)__cxa_allocate_exception(0x28);
      local_60._0_8_ = local_60 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_60,"Only support involve namespace.","");
      compile_error::compile_error(this_00,(string *)local_60);
      __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_40 = raw;
    psVar33 = cs_impl::any::const_val<std::shared_ptr<cs::name_space>>(&local_68);
    domain = ((psVar33->super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             m_data;
    pcVar4 = (domain->m_reflect).
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .ctrl_;
    name = (domain->m_reflect).
           super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           .
           super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           .slots_;
    cVar2 = *pcVar4;
    pcVar38 = pcVar4;
    while (cVar2 < -1) {
      iVar28 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                      CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar15 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar16 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar17 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar38 < (char)iVar28);
      in_XMM1_Bb = -(pcVar38[1] < (char)((uint)iVar28 >> 8));
      in_XMM1_Bc = -(pcVar38[2] < (char)((uint)iVar28 >> 0x10));
      in_XMM1_Bd = -(pcVar38[3] < (char)((uint)iVar28 >> 0x18));
      in_XMM1_Be = -(pcVar38[4] < (char)iVar15);
      in_XMM1_Bf = -(pcVar38[5] < (char)((uint)iVar15 >> 8));
      in_XMM1_Bg = -(pcVar38[6] < (char)((uint)iVar15 >> 0x10));
      in_XMM1_Bh = -(pcVar38[7] < (char)((uint)iVar15 >> 0x18));
      in_XMM1_Bi = -(pcVar38[8] < (char)iVar16);
      in_XMM1_Bj = -(pcVar38[9] < (char)((uint)iVar16 >> 8));
      in_XMM1_Bk = -(pcVar38[10] < (char)((uint)iVar16 >> 0x10));
      in_XMM1_Bl = -(pcVar38[0xb] < (char)((uint)iVar16 >> 0x18));
      in_XMM1_Bm = -(pcVar38[0xc] < (char)iVar17);
      in_XMM1_Bn = -(pcVar38[0xd] < (char)((uint)iVar17 >> 8));
      in_XMM1_Bo = -(pcVar38[0xe] < (char)((uint)iVar17 >> 0x10));
      in_XMM1_Bp = -(pcVar38[0xf] < (char)((uint)iVar17 >> 0x18));
      auVar11[1] = in_XMM1_Bb;
      auVar11[0] = in_XMM1_Ba;
      auVar11[2] = in_XMM1_Bc;
      auVar11[3] = in_XMM1_Bd;
      auVar11[4] = in_XMM1_Be;
      auVar11[5] = in_XMM1_Bf;
      auVar11[6] = in_XMM1_Bg;
      auVar11[7] = in_XMM1_Bh;
      auVar11[8] = in_XMM1_Bi;
      auVar11[9] = in_XMM1_Bj;
      auVar11[10] = in_XMM1_Bk;
      auVar11[0xb] = in_XMM1_Bl;
      auVar11[0xc] = in_XMM1_Bm;
      auVar11[0xd] = in_XMM1_Bn;
      auVar11[0xe] = in_XMM1_Bo;
      auVar11[0xf] = in_XMM1_Bp;
      auVar12[1] = in_XMM1_Bb;
      auVar12[0] = in_XMM1_Ba;
      auVar12[2] = in_XMM1_Bc;
      auVar12[3] = in_XMM1_Bd;
      auVar12[4] = in_XMM1_Be;
      auVar12[5] = in_XMM1_Bf;
      auVar12[6] = in_XMM1_Bg;
      auVar12[7] = in_XMM1_Bh;
      auVar12[8] = in_XMM1_Bi;
      auVar12[9] = in_XMM1_Bj;
      auVar12[10] = in_XMM1_Bk;
      auVar12[0xb] = in_XMM1_Bl;
      auVar12[0xc] = in_XMM1_Bm;
      auVar12[0xd] = in_XMM1_Bn;
      auVar12[0xe] = in_XMM1_Bo;
      auVar12[0xf] = in_XMM1_Bp;
      auVar24[1] = in_XMM1_Bd;
      auVar24[0] = in_XMM1_Bc;
      auVar24[2] = in_XMM1_Be;
      auVar24[3] = in_XMM1_Bf;
      auVar24[4] = in_XMM1_Bg;
      auVar24[5] = in_XMM1_Bh;
      auVar24[6] = in_XMM1_Bi;
      auVar24[7] = in_XMM1_Bj;
      auVar24[8] = in_XMM1_Bk;
      auVar24[9] = in_XMM1_Bl;
      auVar24[10] = in_XMM1_Bm;
      auVar24[0xb] = in_XMM1_Bn;
      auVar24[0xc] = in_XMM1_Bo;
      auVar24[0xd] = in_XMM1_Bp;
      auVar22[1] = in_XMM1_Be;
      auVar22[0] = in_XMM1_Bd;
      auVar22[2] = in_XMM1_Bf;
      auVar22[3] = in_XMM1_Bg;
      auVar22[4] = in_XMM1_Bh;
      auVar22[5] = in_XMM1_Bi;
      auVar22[6] = in_XMM1_Bj;
      auVar22[7] = in_XMM1_Bk;
      auVar22[8] = in_XMM1_Bl;
      auVar22[9] = in_XMM1_Bm;
      auVar22[10] = in_XMM1_Bn;
      auVar22[0xb] = in_XMM1_Bo;
      auVar22[0xc] = in_XMM1_Bp;
      auVar20[1] = in_XMM1_Bf;
      auVar20[0] = in_XMM1_Be;
      auVar20[2] = in_XMM1_Bg;
      auVar20[3] = in_XMM1_Bh;
      auVar20[4] = in_XMM1_Bi;
      auVar20[5] = in_XMM1_Bj;
      auVar20[6] = in_XMM1_Bk;
      auVar20[7] = in_XMM1_Bl;
      auVar20[8] = in_XMM1_Bm;
      auVar20[9] = in_XMM1_Bn;
      auVar20[10] = in_XMM1_Bo;
      auVar20[0xb] = in_XMM1_Bp;
      auVar18[1] = in_XMM1_Bg;
      auVar18[0] = in_XMM1_Bf;
      auVar18[2] = in_XMM1_Bh;
      auVar18[3] = in_XMM1_Bi;
      auVar18[4] = in_XMM1_Bj;
      auVar18[5] = in_XMM1_Bk;
      auVar18[6] = in_XMM1_Bl;
      auVar18[7] = in_XMM1_Bm;
      auVar18[8] = in_XMM1_Bn;
      auVar18[9] = in_XMM1_Bo;
      auVar18[10] = in_XMM1_Bp;
      uVar35 = (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar24 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar22 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar20 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar18 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar10 = 0;
      if (uVar35 != 0) {
        for (; (uVar35 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      name = name + uVar10;
      cVar2 = pcVar38[uVar10];
      pcVar38 = pcVar38 + uVar10;
    }
    sVar36 = (domain->m_reflect).
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .capacity_;
    local_38 = this;
    while (pcVar38 != pcVar4 + sVar36) {
      ppVar5 = (domain->m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
               _M_impl.super__Vector_impl_data._M_start[(name->value).second].mDat;
      if ((ppVar5 != (proxy *)0x0) && (0 < ppVar5->protect_level)) {
        domain_manager::add_record
                  (&(((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->instance).
                      super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_runtime_type).storage,&(name->value).first);
      }
      name = name + 1;
      cVar2 = pcVar38[1];
      pcVar38 = pcVar38 + 1;
      while (cVar2 < -1) {
        iVar28 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        == CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        );
        iVar15 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        == CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        );
        iVar16 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        == CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        );
        iVar17 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar38 < (char)iVar28);
        in_XMM1_Bb = -(pcVar38[1] < (char)((uint)iVar28 >> 8));
        in_XMM1_Bc = -(pcVar38[2] < (char)((uint)iVar28 >> 0x10));
        in_XMM1_Bd = -(pcVar38[3] < (char)((uint)iVar28 >> 0x18));
        in_XMM1_Be = -(pcVar38[4] < (char)iVar15);
        in_XMM1_Bf = -(pcVar38[5] < (char)((uint)iVar15 >> 8));
        in_XMM1_Bg = -(pcVar38[6] < (char)((uint)iVar15 >> 0x10));
        in_XMM1_Bh = -(pcVar38[7] < (char)((uint)iVar15 >> 0x18));
        in_XMM1_Bi = -(pcVar38[8] < (char)iVar16);
        in_XMM1_Bj = -(pcVar38[9] < (char)((uint)iVar16 >> 8));
        in_XMM1_Bk = -(pcVar38[10] < (char)((uint)iVar16 >> 0x10));
        in_XMM1_Bl = -(pcVar38[0xb] < (char)((uint)iVar16 >> 0x18));
        in_XMM1_Bm = -(pcVar38[0xc] < (char)iVar17);
        in_XMM1_Bn = -(pcVar38[0xd] < (char)((uint)iVar17 >> 8));
        in_XMM1_Bo = -(pcVar38[0xe] < (char)((uint)iVar17 >> 0x10));
        in_XMM1_Bp = -(pcVar38[0xf] < (char)((uint)iVar17 >> 0x18));
        auVar13[1] = in_XMM1_Bb;
        auVar13[0] = in_XMM1_Ba;
        auVar13[2] = in_XMM1_Bc;
        auVar13[3] = in_XMM1_Bd;
        auVar13[4] = in_XMM1_Be;
        auVar13[5] = in_XMM1_Bf;
        auVar13[6] = in_XMM1_Bg;
        auVar13[7] = in_XMM1_Bh;
        auVar13[8] = in_XMM1_Bi;
        auVar13[9] = in_XMM1_Bj;
        auVar13[10] = in_XMM1_Bk;
        auVar13[0xb] = in_XMM1_Bl;
        auVar13[0xc] = in_XMM1_Bm;
        auVar13[0xd] = in_XMM1_Bn;
        auVar13[0xe] = in_XMM1_Bo;
        auVar13[0xf] = in_XMM1_Bp;
        auVar14[1] = in_XMM1_Bb;
        auVar14[0] = in_XMM1_Ba;
        auVar14[2] = in_XMM1_Bc;
        auVar14[3] = in_XMM1_Bd;
        auVar14[4] = in_XMM1_Be;
        auVar14[5] = in_XMM1_Bf;
        auVar14[6] = in_XMM1_Bg;
        auVar14[7] = in_XMM1_Bh;
        auVar14[8] = in_XMM1_Bi;
        auVar14[9] = in_XMM1_Bj;
        auVar14[10] = in_XMM1_Bk;
        auVar14[0xb] = in_XMM1_Bl;
        auVar14[0xc] = in_XMM1_Bm;
        auVar14[0xd] = in_XMM1_Bn;
        auVar14[0xe] = in_XMM1_Bo;
        auVar14[0xf] = in_XMM1_Bp;
        auVar25[1] = in_XMM1_Bd;
        auVar25[0] = in_XMM1_Bc;
        auVar25[2] = in_XMM1_Be;
        auVar25[3] = in_XMM1_Bf;
        auVar25[4] = in_XMM1_Bg;
        auVar25[5] = in_XMM1_Bh;
        auVar25[6] = in_XMM1_Bi;
        auVar25[7] = in_XMM1_Bj;
        auVar25[8] = in_XMM1_Bk;
        auVar25[9] = in_XMM1_Bl;
        auVar25[10] = in_XMM1_Bm;
        auVar25[0xb] = in_XMM1_Bn;
        auVar25[0xc] = in_XMM1_Bo;
        auVar25[0xd] = in_XMM1_Bp;
        auVar23[1] = in_XMM1_Be;
        auVar23[0] = in_XMM1_Bd;
        auVar23[2] = in_XMM1_Bf;
        auVar23[3] = in_XMM1_Bg;
        auVar23[4] = in_XMM1_Bh;
        auVar23[5] = in_XMM1_Bi;
        auVar23[6] = in_XMM1_Bj;
        auVar23[7] = in_XMM1_Bk;
        auVar23[8] = in_XMM1_Bl;
        auVar23[9] = in_XMM1_Bm;
        auVar23[10] = in_XMM1_Bn;
        auVar23[0xb] = in_XMM1_Bo;
        auVar23[0xc] = in_XMM1_Bp;
        auVar21[1] = in_XMM1_Bf;
        auVar21[0] = in_XMM1_Be;
        auVar21[2] = in_XMM1_Bg;
        auVar21[3] = in_XMM1_Bh;
        auVar21[4] = in_XMM1_Bi;
        auVar21[5] = in_XMM1_Bj;
        auVar21[6] = in_XMM1_Bk;
        auVar21[7] = in_XMM1_Bl;
        auVar21[8] = in_XMM1_Bm;
        auVar21[9] = in_XMM1_Bn;
        auVar21[10] = in_XMM1_Bo;
        auVar21[0xb] = in_XMM1_Bp;
        auVar19[1] = in_XMM1_Bg;
        auVar19[0] = in_XMM1_Bf;
        auVar19[2] = in_XMM1_Bh;
        auVar19[3] = in_XMM1_Bi;
        auVar19[4] = in_XMM1_Bj;
        auVar19[5] = in_XMM1_Bk;
        auVar19[6] = in_XMM1_Bl;
        auVar19[7] = in_XMM1_Bm;
        auVar19[8] = in_XMM1_Bn;
        auVar19[9] = in_XMM1_Bo;
        auVar19[10] = in_XMM1_Bp;
        uVar35 = (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar25 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar23 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar21 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar19 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar10 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        name = name + uVar10;
        cVar2 = pcVar38[uVar10];
        pcVar38 = pcVar38 + uVar10;
      }
    }
    domain_manager::involve_domain
              (&(((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)->instance).
                  super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_runtime_type).storage,domain,false);
    pmVar27 = local_38;
    ptVar34 = (tree_node *)statement_base::operator_new((statement_base *)0x30,(size_t)domain);
    pdVar26 = local_40;
    iVar28 = tree_type<cs::token_base_*>::copy
                       ((EVP_PKEY_CTX *)ptVar3[1]._vptr_token_base,(EVP_PKEY_CTX *)0x0);
    peVar6 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var7 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
    pdVar8 = (pdVar26->
             super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar37 = (pdVar8->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar37 ==
        (pdVar8->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar37 = (pdVar8->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ptVar31 = pptVar37[-1];
    ptVar34->root = (tree_node *)&PTR__statement_base_0032c410;
    (((context_t *)&ptVar34->left)->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = peVar6;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptVar34->right)->_M_pi = p_Var7;
    ptVar34->data = (token_base *)ptVar31->line_num;
    ptVar34->root = (tree_node *)&PTR__statement_involve_0032cf90;
    *(undefined1 *)&ptVar34[1].root = 1;
    (((context_t *)&ptVar34[1].left)->
    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)CONCAT44(extraout_var_01,iVar28);
    ppsVar9 = (pmVar27->mResult).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    local_60._0_8_ = ptVar34;
    if (ppsVar9 ==
        (pmVar27->mResult).
        super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
      _M_push_back_aux<cs::statement_involve*>
                ((deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)&pmVar27->mResult
                 ,(statement_involve **)local_60);
    }
    else {
      *ppsVar9 = (statement_base *)ptVar34;
      piVar1 = &(pmVar27->mResult).
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
    cs_impl::any::recycle(&local_68);
  }
  return;
}

Assistant:

void method_involve::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		token_value *vptr = dynamic_cast<token_value *>(tree.root().data());
		if (vptr != nullptr) {
			var ns = vptr->get_value();
			if (ns.type() == typeid(namespace_t)) {
				auto &domain = ns.const_val<namespace_t>()->get_domain();
				for (auto &it: domain) {
					if (domain.get_var_by_id(it.second).is_protect())
						context->instance->storage.add_record(it.first);
				}
				context->instance->storage.involve_domain(domain);
			}
			else
				throw compile_error("Only support involve namespace.");
			mResult.emplace_back(new statement_involve(tree, true, context, raw.front().back()));
		}
		else
			mResult.emplace_back(new statement_involve(tree, false, context, raw.front().back()));
	}